

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

void __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::
FreeList<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
::add(FreeList<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
      *this,Block *node)

{
  atomic<unsigned_int> *paVar1;
  __int_type_conflict1 _Var2;
  __pointer_type pBVar3;
  __pointer_type pBVar4;
  bool bVar5;
  
  LOCK();
  paVar1 = &node->freeListRefs;
  _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
  UNLOCK();
  if (_Var2 != 0) {
    return;
  }
  pBVar3 = (this->freeListHead)._M_b._M_p;
  while( true ) {
    (node->freeListNext)._M_b._M_p = pBVar3;
    (node->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
    LOCK();
    pBVar4 = (this->freeListHead)._M_b._M_p;
    bVar5 = pBVar3 == pBVar4;
    if (bVar5) {
      (this->freeListHead)._M_b._M_p = node;
      pBVar4 = pBVar3;
    }
    UNLOCK();
    if (bVar5) break;
    LOCK();
    paVar1 = &node->freeListRefs;
    _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
    UNLOCK();
    pBVar3 = pBVar4;
    if (_Var2 != 1) {
      return;
    }
  }
  return;
}

Assistant:

inline void add(N* node) {
#ifdef MCDBGQ_NOLOCKFREE_FREELIST
      debug::DebugLock lock(mutex);
#endif
      // We know that the should-be-on-freelist bit is 0 at this point, so it's
      // safe to set it using a fetch_add
      if (node->freeListRefs.fetch_add(SHOULD_BE_ON_FREELIST,
                                       std::memory_order_acq_rel) == 0) {
        // Oh look! We were the last ones referencing this node, and we know
        // we want to add it to the free list, so let's do it!
        add_knowing_refcount_is_zero(node);
      }
    }